

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

size_t zt_cstr_rcspn(char *s,char *reject)

{
  size_t sVar1;
  size_t sVar2;
  char *in_RSI;
  char *in_RDI;
  ssize_t i;
  size_t len;
  size_t local_28;
  
  sVar1 = strlen(in_RDI);
  local_28 = sVar1;
  do {
    local_28 = local_28 - 1;
    if ((long)local_28 < 1) {
      return sVar1;
    }
    sVar2 = strcspn(in_RDI + local_28,in_RSI);
  } while (sVar2 != 0);
  return local_28;
}

Assistant:

size_t
zt_cstr_rcspn(const char *s, const char *reject) {
    size_t    len = strlen(s);
    ssize_t   i   = 0;

    zt_assert(s);
    zt_assert(reject);

    for (i = len - 1; i > 0; i--) { /* -1 to skip \0 */
        if (strcspn(&s[i], reject) == 0) {
            return i;                                      /* -1 for the first non matching char */
        }
    }
    return len;
}